

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O0

void inithess_l(double *H,int N,int k,double *tsk,double *tyk,double *dx)

{
  double *C;
  double *C_00;
  double *den;
  double *num;
  double temp;
  int local_38;
  int ct;
  int j;
  int i;
  double *dx_local;
  double *tyk_local;
  double *tsk_local;
  int k_local;
  int N_local;
  double *H_local;
  
  C = (double *)malloc(8);
  C_00 = (double *)malloc(8);
  mmult(tsk,tyk,C,1,N,1);
  mmult(tyk,tyk,C_00,1,N,1);
  if (k < 1) {
    num = (double *)0x3ff0000000000000;
  }
  else {
    num = (double *)(*C / *C_00);
  }
  for (ct = 0; ct < N; ct = ct + 1) {
    for (local_38 = 0; local_38 < N; local_38 = local_38 + 1) {
      if (ct == local_38) {
        H[ct * N + local_38] = (double)num * dx[ct] * dx[ct];
      }
      else {
        H[ct * N + local_38] = 0.0;
      }
    }
  }
  free(C);
  free(C_00);
  return;
}

Assistant:

void inithess_l(double *H, int N, int k, double *tsk,double *tyk, double *dx) {
	int i, j, ct;
	double temp;
	double *num, *den;

	num = (double*)malloc(sizeof(double)*1);
	den = (double*)malloc(sizeof(double)*1);

	mmult(tsk, tyk, num, 1, N, 1);
	mmult(tyk, tyk, den, 1, N, 1);

	if (k > 0) {
		temp = num[0] / den[0];
	}
	else {
		temp = 1.0;
	}

	for (i = 0; i < N; ++i) {
		ct = i *N;
		for (j = 0; j < N; ++j) {
			if (i == j) {
				H[ct + j] = temp * dx[i] * dx[i];
			}
			else {
				H[ct + j] = 0.0;
			}

		}
	}

	free(num);
	free(den);

}